

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_allocation_callbacks * ma_allocation_callbacks_init_default(void)

{
  ma_allocation_callbacks *in_RDI;
  ma_allocation_callbacks *callbacks;
  
  in_RDI->pUserData = (void *)0x0;
  in_RDI->onMalloc = ma__malloc_default;
  in_RDI->onRealloc = ma__realloc_default;
  in_RDI->onFree = ma__free_default;
  return in_RDI;
}

Assistant:

static ma_allocation_callbacks ma_allocation_callbacks_init_default()
{
    ma_allocation_callbacks callbacks;
    callbacks.pUserData = NULL;
    callbacks.onMalloc  = ma__malloc_default;
    callbacks.onRealloc = ma__realloc_default;
    callbacks.onFree    = ma__free_default;

    return callbacks;
}